

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::GLES2ThreadedSharingTest::addShaderOperations(GLES2ThreadedSharingTest *this,GLenum type)

{
  deInt32 *pdVar1;
  EGLThread *pEVar2;
  SharedPtrStateBase *pSVar3;
  pointer ppEVar4;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *pSVar5;
  CreateShader *this_00;
  ShaderSource *pSVar6;
  ShaderCompile *pSVar7;
  DeleteShader *pDVar8;
  char *pcVar9;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> shader;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_98;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_80;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_70;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_60;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_50;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_40;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_30;
  
  local_98.m_ptr = (Shader *)0x0;
  local_98.m_state = (SharedPtrStateBase *)0x0;
  pEVar2 = *(this->m_threads).
            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  this_00 = (CreateShader *)operator_new(0x80);
  GLES2ThreadTest::CreateShader::CreateShader
            (this_00,type,&local_98,(this->m_config).useFenceSync,(this->m_config).serverSync);
  tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)this_00);
  if ((this->m_config).define != 0) {
    if (((this->m_config).modify == 0) && ((this->m_config).render != true)) {
      pEVar2 = (this->m_threads).
               super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
               ._M_impl.super__Vector_impl_data._M_start[1];
      pSVar6 = (ShaderSource *)operator_new(0x98);
      local_40.m_ptr = local_98.m_ptr;
      local_40.m_state = local_98.m_state;
      if (local_98.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_98.m_state)->strongRefCount = (local_98.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (local_98.m_state)->weakRefCount = (local_98.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pcVar9 = "void main(void)\n{\n\tgl_FragColor = vec4(1.0, 0.0, 0.0, 1.0);\n}";
      if (type == 0x8b31) {
        pcVar9 = "attribute mediump vec4 a_pos;\nvoid main(void)\n{\n\tgl_Position = a_pos;\n}";
      }
      GLES2ThreadTest::ShaderSource::ShaderSource
                (pSVar6,&local_40,pcVar9,(this->m_config).useFenceSync,(this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pSVar6);
      if (local_40.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_40.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_40.m_ptr = (Shader *)0x0;
          (*(local_40.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_40.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_40;
LAB_001d8481:
          pSVar3 = pSVar5->m_state;
          if (pSVar3 != (SharedPtrStateBase *)0x0) {
            (*pSVar3->_vptr_SharedPtrStateBase[1])();
          }
          pSVar5->m_state = (SharedPtrStateBase *)0x0;
        }
      }
    }
    else {
      pEVar2 = *(this->m_threads).
                super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar6 = (ShaderSource *)operator_new(0x98);
      local_30.m_ptr = local_98.m_ptr;
      local_30.m_state = local_98.m_state;
      if (local_98.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_98.m_state)->strongRefCount = (local_98.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (local_98.m_state)->weakRefCount = (local_98.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pcVar9 = "void main(void)\n{\n\tgl_FragColor = vec4(1.0, 0.0, 0.0, 1.0);\n}";
      if (type == 0x8b31) {
        pcVar9 = "attribute mediump vec4 a_pos;\nvoid main(void)\n{\n\tgl_Position = a_pos;\n}";
      }
      GLES2ThreadTest::ShaderSource::ShaderSource
                (pSVar6,&local_30,pcVar9,(this->m_config).useFenceSync,(this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pSVar6);
      if (local_30.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_30.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_30.m_ptr = (Shader *)0x0;
          (*(local_30.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_30.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_30;
          goto LAB_001d8481;
        }
      }
    }
  }
  if ((this->m_config).modify != 0) {
    ppEVar4 = (this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_config).render == true) {
      pEVar2 = *ppEVar4;
      pSVar7 = (ShaderCompile *)operator_new(0x78);
      local_50.m_ptr = local_98.m_ptr;
      local_50.m_state = local_98.m_state;
      if (local_98.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_98.m_state)->strongRefCount = (local_98.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (local_98.m_state)->weakRefCount = (local_98.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::ShaderCompile::ShaderCompile
                (pSVar7,&local_50,(this->m_config).useFenceSync,(this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pSVar7);
      if (local_50.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_50.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_50.m_ptr = (Shader *)0x0;
          (*(local_50.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_50.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_50;
LAB_001d85ed:
          pSVar3 = pSVar5->m_state;
          if (pSVar3 != (SharedPtrStateBase *)0x0) {
            (*pSVar3->_vptr_SharedPtrStateBase[1])();
          }
          pSVar5->m_state = (SharedPtrStateBase *)0x0;
        }
      }
    }
    else {
      pEVar2 = ppEVar4[1];
      pSVar7 = (ShaderCompile *)operator_new(0x78);
      local_60.m_ptr = local_98.m_ptr;
      local_60.m_state = local_98.m_state;
      if (local_98.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_98.m_state)->strongRefCount = (local_98.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (local_98.m_state)->weakRefCount = (local_98.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::ShaderCompile::ShaderCompile
                (pSVar7,&local_60,(this->m_config).useFenceSync,(this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pSVar7);
      if (local_60.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_60.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_60.m_ptr = (Shader *)0x0;
          (*(local_60.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_60.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_60;
          goto LAB_001d85ed;
        }
      }
    }
  }
  if (((this->m_config).modify == 0) && ((this->m_config).render != true)) {
    pEVar2 = (this->m_threads).
             super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
             ._M_impl.super__Vector_impl_data._M_start[1];
    pDVar8 = (DeleteShader *)operator_new(0x78);
    local_80.m_ptr = local_98.m_ptr;
    local_80.m_state = local_98.m_state;
    if (local_98.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_98.m_state)->strongRefCount = (local_98.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (local_98.m_state)->weakRefCount = (local_98.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::DeleteShader::DeleteShader
              (pDVar8,&local_80,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pDVar8);
    if (local_80.m_state == (SharedPtrStateBase *)0x0) goto LAB_001d86c8;
    LOCK();
    pdVar1 = &(local_80.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_80.m_ptr = (Shader *)0x0;
      (*(local_80.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_80.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 != 0) goto LAB_001d86c8;
    pSVar5 = &local_80;
  }
  else {
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pDVar8 = (DeleteShader *)operator_new(0x78);
    local_70.m_ptr = local_98.m_ptr;
    local_70.m_state = local_98.m_state;
    if (local_98.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_98.m_state)->strongRefCount = (local_98.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (local_98.m_state)->weakRefCount = (local_98.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::DeleteShader::DeleteShader
              (pDVar8,&local_70,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pDVar8);
    if (local_70.m_state == (SharedPtrStateBase *)0x0) goto LAB_001d86c8;
    LOCK();
    pdVar1 = &(local_70.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_70.m_ptr = (Shader *)0x0;
      (*(local_70.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_70.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 != 0) goto LAB_001d86c8;
    pSVar5 = &local_70;
  }
  pSVar3 = pSVar5->m_state;
  if (pSVar3 != (SharedPtrStateBase *)0x0) {
    (*pSVar3->_vptr_SharedPtrStateBase[1])();
  }
  pSVar5->m_state = (SharedPtrStateBase *)0x0;
LAB_001d86c8:
  if (local_98.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_98.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_98.m_ptr = (Shader *)0x0;
      (*(local_98.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_98.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_98.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_98.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

void GLES2ThreadedSharingTest::addShaderOperations (GLenum type)
{
	SharedPtr<GLES2ThreadTest::Shader> shader;

	m_threads[0]->addOperation(new GLES2ThreadTest::CreateShader(type, shader, m_config.useFenceSync, m_config.serverSync));

	if (m_config.define)
	{
		const char* vertexShaderSource =
		"attribute mediump vec4 a_pos;\n"
		"void main(void)\n"
		"{\n"
		"\tgl_Position = a_pos;\n"
		"}";

		const char* fragmentShaderSource =
		"void main(void)\n"
		"{\n"
		"\tgl_FragColor = vec4(1.0, 0.0, 0.0, 1.0);\n"
		"}";

		if (m_config.modify || m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::ShaderSource(shader, (type == GL_VERTEX_SHADER ? vertexShaderSource : fragmentShaderSource), m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::ShaderSource(shader, (type == GL_VERTEX_SHADER ? vertexShaderSource : fragmentShaderSource), m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.modify)
	{
		if (m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::ShaderCompile(shader, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::ShaderCompile(shader, m_config.useFenceSync, m_config.serverSync));
	}

	DE_ASSERT(!m_config.render);

	if (m_config.modify || m_config.render)
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteShader(shader, m_config.useFenceSync, m_config.serverSync));
	else
		m_threads[1]->addOperation(new GLES2ThreadTest::DeleteShader(shader, m_config.useFenceSync, m_config.serverSync));
}